

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

void * xmlCatalogAddLocal(void *catalogs,xmlChar *URL)

{
  long *plVar1;
  xmlCatalogEntryPtr pxVar2;
  long *plVar3;
  xmlCatalogEntryPtr pxVar4;
  
  xmlInitParser();
  pxVar4 = (xmlCatalogEntryPtr)catalogs;
  if (URL != (xmlChar *)0x0) {
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Adding document catalog %s\n");
    }
    pxVar2 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,URL,(xmlChar *)0x0,
                                xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
    if ((pxVar2 != (xmlCatalogEntryPtr)0x0) &&
       (plVar1 = (long *)catalogs, pxVar4 = pxVar2, catalogs != (void *)0x0)) {
      do {
        plVar3 = plVar1;
        plVar1 = (long *)*plVar3;
      } while (plVar1 != (long *)0x0);
      *plVar3 = (long)pxVar2;
      pxVar4 = (xmlCatalogEntryPtr)catalogs;
    }
  }
  return pxVar4;
}

Assistant:

void *
xmlCatalogAddLocal(void *catalogs, const xmlChar *URL) {
    xmlCatalogEntryPtr catal, add;

    xmlInitParser();

    if (URL == NULL)
	return(catalogs);

    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Adding document catalog %s\n", URL);

    add = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL, URL, NULL,
	                     xmlCatalogDefaultPrefer, NULL);
    if (add == NULL)
	return(catalogs);

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return((void *) add);

    while (catal->next != NULL)
	catal = catal->next;
    catal->next = add;
    return(catalogs);
}